

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O0

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  Message *pMVar4;
  reference ppcVar5;
  char *pcVar6;
  char *pcVar7;
  pair<std::_Rb_tree_const_iterator<testing::internal::String>,_bool> pVar8;
  String local_f8;
  String local_e8;
  String *local_d8;
  String *errors_str;
  _Self local_c0;
  _Self local_b8;
  DefinedTestIter it_1;
  _Self local_a0;
  _Self local_98;
  DefinedTestIter it;
  bool found;
  undefined1 local_78 [8];
  String name;
  char *names;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  Message errors;
  char *registered_tests_local;
  int line_local;
  char *file_local;
  TypedTestCasePState *this_local;
  
  *this = (TypedTestCasePState)0x1;
  pcVar2 = SkipSpaces(registered_tests);
  Message::Message((Message *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  ::set((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
         *)&names);
  name.length_ = (size_t)pcVar2;
  do {
    if (name.length_ == 0) {
      local_b8._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      (this + 8));
      while( true ) {
        local_c0._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )(this + 8));
        bVar1 = std::operator!=(&local_b8,&local_c0);
        if (!bVar1) break;
        ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_b8);
        String::String((String *)&errors_str,*ppcVar5);
        sVar3 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                         *)&names,(key_type *)&errors_str);
        String::~String((String *)&errors_str);
        if (sVar3 == 0) {
          pMVar4 = Message::operator<<((Message *)
                                       &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                       (char (*) [25])"You forgot to list test ");
          ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_b8);
          pMVar4 = Message::operator<<(pMVar4,ppcVar5);
          Message::operator<<(pMVar4,(char (*) [3])0x16c646);
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++(&local_b8);
      }
      Message::GetString((Message *)&local_e8);
      local_d8 = &local_e8;
      bVar1 = String::operator!=(local_d8,"");
      __stream = _stderr;
      if (bVar1) {
        FormatFileLocation((internal *)&local_f8,file,line);
        pcVar6 = String::c_str(&local_f8);
        pcVar7 = String::c_str(local_d8);
        fprintf(__stream,"%s %s",pcVar6,pcVar7);
        String::~String(&local_f8);
        fflush(_stderr);
        posix::Abort();
      }
      String::~String(&local_e8);
      std::
      set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
      ::~set((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
              *)&names);
      Message::~Message((Message *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return pcVar2;
    }
    GetPrefixUntilComma((internal *)local_78,(char *)name.length_);
    sVar3 = std::
            set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)&names,(key_type *)local_78);
    if (sVar3 == 0) {
      it._M_node._7_1_ = 0;
      local_98._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      (this + 8));
      while( true ) {
        local_a0._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )(this + 8));
        bVar1 = std::operator!=(&local_98,&local_a0);
        if (!bVar1) break;
        ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_98);
        bVar1 = String::operator==((String *)local_78,*ppcVar5);
        if (bVar1) {
          it._M_node._7_1_ = 1;
          break;
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++(&local_98);
      }
      if ((it._M_node._7_1_ & 1) == 0) {
        pMVar4 = Message::operator<<((Message *)
                                     &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (char (*) [15])"No test named ");
        pMVar4 = Message::operator<<(pMVar4,(String *)local_78);
        Message::operator<<(pMVar4,(char (*) [34])" can be found in this test case.\n");
      }
      else {
        pVar8 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::insert((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                          *)&names,(value_type *)local_78);
        it_1._M_node = (_Base_ptr)pVar8.first._M_node;
      }
    }
    else {
      pMVar4 = Message::operator<<((Message *)
                                   &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (char (*) [6])"Test ");
      pMVar4 = Message::operator<<(pMVar4,(String *)local_78);
      Message::operator<<(pMVar4,(char (*) [28])" is listed more than once.\n");
    }
    String::~String((String *)local_78);
    name.length_ = (size_t)SkipComma((char *)name.length_);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}